

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

string * __thiscall
Assembler::instructionToAssembly_abi_cxx11_
          (string *__return_storage_ptr__,Assembler *this,Instruction *ins)

{
  bool bVar1;
  int32_t iVar2;
  pointer ppVar3;
  Error *this_00;
  pair<int,_int> pVar4;
  int iStack_14c;
  string local_148;
  pair<int,_int> local_128;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  pair<int,_int> local_c0;
  string local_b8;
  undefined1 local_92;
  allocator<char> local_91;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  _Self local_50 [3];
  Operation local_34;
  _Self local_30;
  iterator it;
  Instruction *ins_local;
  Assembler *this_local;
  string *ret;
  
  it._M_node._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_34 = Instruction::getOpr(ins);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<Operation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Operation>,_std::allocator<std::pair<const_Operation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&ITATable_abi_cxx11_,&local_34);
  local_50[0]._M_node =
       (_Base_ptr)
       std::
       map<Operation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Operation>,_std::allocator<std::pair<const_Operation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&ITATable_abi_cxx11_);
  bVar1 = std::operator!=(&local_30,local_50);
  if (!bVar1) {
    local_92 = 1;
    this_00 = (Error *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"Unvalid operation type",&local_91);
    Error::Error(this_00,&local_90);
    local_92 = 0;
    __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
  }
  ppVar3 = std::
           _Rb_tree_iterator<std::pair<const_Operation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->(&local_30);
  std::operator+(&local_70,&ppVar3->second,'\t');
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  iVar2 = Instruction::getParamNum(ins);
  if (iVar2 != 0) {
    if (iVar2 == 1) {
      local_c0 = Instruction::getParam(ins);
      std::__cxx11::to_string(&local_b8,local_c0.first);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    else if (iVar2 == 2) {
      local_128 = Instruction::getParam(ins);
      std::__cxx11::to_string(&local_120,local_128.first);
      std::operator+(&local_100,&local_120,", ");
      pVar4 = Instruction::getParam(ins);
      iStack_14c = pVar4.second;
      std::__cxx11::to_string(&local_148,iStack_14c);
      std::operator+(&local_e0,&local_100,&local_148);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Assembler::instructionToAssembly(Instruction & ins) {
	std::string ret;
	if (auto it = ITATable.find(ins.getOpr()); it != ITATable.end()) {
		ret += it->second + '\t';
	}
	else {
		throw Error("Unvalid operation type");
	}
	switch (ins.getParamNum())
	{
	case 0:
		break;
	case 1:
		ret += std::to_string(ins.getParam().first);
		break;
	case 2:
		ret += std::to_string(ins.getParam().first) + ", " + std::to_string(ins.getParam().second);
		break;
	default:
		break;
	}
	return ret;
}